

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

void __thiscall
adios2sys::CommandLineArguments::AddCallback
          (CommandLineArguments *this,char *argument,ArgumentTypeEnum type,CallbackType callback,
          void *call_data,char *help)

{
  Internal *pIVar1;
  mapped_type *pmVar2;
  allocator local_61;
  void *local_60;
  char *local_58;
  key_type local_50;
  
  pIVar1 = this->Internals;
  local_60 = call_data;
  local_58 = help;
  std::__cxx11::string::string((string *)&local_50,argument,&local_61);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
           ::operator[](&(pIVar1->Callbacks).
                         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
                        ,&local_50);
  pmVar2->Argument = argument;
  pmVar2->ArgumentType = type;
  pmVar2->Callback = callback;
  pmVar2->CallData = local_60;
  pmVar2->Variable = (void *)0x0;
  pmVar2->VariableType = 0;
  pmVar2->Help = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  GenerateHelp(this);
  return;
}

Assistant:

void CommandLineArguments::AddCallback(const char* argument,
                                       ArgumentTypeEnum type,
                                       CallbackType callback, void* call_data,
                                       const char* help)
{
  CommandLineArgumentsCallbackStructure s;
  s.Argument = argument;
  s.ArgumentType = type;
  s.Callback = callback;
  s.CallData = call_data;
  s.VariableType = CommandLineArguments::NO_VARIABLE_TYPE;
  s.Variable = nullptr;
  s.Help = help;

  this->Internals->Callbacks[argument] = s;
  this->GenerateHelp();
}